

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                 *handler)

{
  type tVar1;
  int iVar2;
  char *pcVar3;
  precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
  local_20;
  char *local_18;
  
  local_18 = begin + 1;
  if (local_18 == end) {
LAB_00120143:
    pcVar3 = "missing precision specifier";
  }
  else {
    if ((int)*local_18 - 0x30U < 10) {
      iVar2 = parse_nonnegative_int<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                        (&local_18,end,handler);
      ((handler->
       super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
       ).super_specs_setter<char>.specs_)->precision = iVar2;
    }
    else {
      if (*local_18 != '{') goto LAB_00120143;
      pcVar3 = begin + 2;
      if (pcVar3 != end) {
        local_20.handler = handler;
        pcVar3 = parse_arg_id<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>>
                           (pcVar3,end,&local_20);
      }
      if ((pcVar3 == end) || (local_18 = pcVar3 + 1, *pcVar3 != '}')) {
        pcVar3 = "invalid format string";
        goto LAB_00120139;
      }
    }
    tVar1 = (handler->checker_).arg_type_;
    if ((pointer_type < tVar1) || ((0x41feU >> (tVar1 & 0x1f) & 1) == 0)) {
      return local_18;
    }
    pcVar3 = "precision not allowed for this argument type";
  }
LAB_00120139:
  error_handler::on_error((error_handler *)&local_20,pcVar3);
}

Assistant:

FMT_CONSTEXPR const Char* parse_precision(const Char* begin, const Char* end,
                                          Handler&& handler) {
  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    handler.on_precision(parse_nonnegative_int(begin, end, handler));
  } else if (c == '{') {
    ++begin;
    if (begin != end) {
      begin =
          parse_arg_id(begin, end, precision_adapter<Handler, Char>(handler));
    }
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}